

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

size_t fio_ltoa(char *dest,int64_t num,uint8_t base)

{
  undefined1 auVar1 [16];
  char cVar2;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  char cStack_39;
  char buf [48];
  
  if (num == 0) {
    if (base - 1 < 2) {
      dest[0] = '0';
      dest[1] = 'b';
      lVar6 = 2;
    }
    else if (base == '\b') {
      *dest = '0';
      lVar6 = 1;
    }
    else if (base == '\x10') {
      dest[0] = '0';
      dest[1] = 'x';
      dest[2] = '0';
      lVar6 = 3;
    }
    else {
      lVar6 = 0;
    }
    dest[lVar6] = '0';
    sVar3 = lVar6 + 1;
  }
  else {
    switch(base) {
    case '\x01':
    case '\x02':
      dest[0] = '0';
      dest[1] = 'b';
      bVar4 = 0;
      for (; (bVar4 < 0x40 && (-1 < num)); num = num * 2) {
        bVar4 = bVar4 + 1;
      }
      if (bVar4 == 0) {
        uVar5 = 2;
      }
      else {
        dest[2] = '0';
        uVar5 = 3;
      }
      sVar3 = (size_t)(byte)(((char)uVar5 - bVar4) + 0x40);
      for (; sVar3 != uVar5; uVar5 = uVar5 + 1) {
        dest[uVar5] = -1 < num ^ 0x31;
        num = num * 2;
      }
      break;
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\t':
      bVar7 = num < 0;
      if (bVar7) {
        *dest = '-';
        num = -num;
      }
      sVar3 = (size_t)bVar7;
      lVar6 = 0;
      for (; num != 0; num = (ulong)num / (ulong)base) {
        buf[lVar6] = (char)((ulong)num % (ulong)base) + '0';
        lVar6 = lVar6 + 1;
      }
      while (lVar6 != 0) {
        dest[sVar3] = buf[lVar6 + -1];
        sVar3 = sVar3 + 1;
        lVar6 = lVar6 + -1;
      }
      break;
    case '\b':
      bVar7 = num < 0;
      if (bVar7) {
        *dest = '-';
        num = -num;
      }
      sVar3 = (size_t)bVar7;
      dest[sVar3] = '0';
      lVar6 = 0;
      for (; num != 0; num = (ulong)num >> 3) {
        buf[lVar6] = (byte)num & 7 | 0x30;
        lVar6 = lVar6 + 1;
      }
      while( true ) {
        sVar3 = sVar3 + 1;
        if (lVar6 == 0) break;
        dest[sVar3] = buf[lVar6 + -1];
        lVar6 = lVar6 + -1;
      }
      break;
    default:
      bVar7 = num < 0;
      if (bVar7) {
        *dest = '-';
        num = -num;
      }
      sVar3 = (size_t)bVar7;
      lVar6 = 0;
      while (num != 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = num;
        buf[lVar6] = (char)num + SUB161(auVar1 / ZEXT816(10),0) * -10 + '0';
        lVar6 = lVar6 + 1;
        num = SUB168(auVar1 / ZEXT816(10),0);
      }
      while (lVar6 != 0) {
        dest[sVar3] = buf[lVar6 + -1];
        sVar3 = sVar3 + 1;
        lVar6 = lVar6 + -1;
      }
      break;
    case '\x10':
      dest[0] = '0';
      dest[1] = 'x';
      bVar4 = 0;
      for (; (bVar4 < 8 && ((ulong)num >> 0x38 == 0)); num = num << 8) {
        bVar4 = bVar4 + 1;
      }
      if (num < 0 && bVar4 != 0) {
        dest[2] = '0';
        dest[3] = '0';
        sVar3 = 4;
      }
      else {
        sVar3 = 2;
      }
      cVar2 = '\b' - bVar4;
      while (bVar7 = cVar2 != '\0', cVar2 = cVar2 + -1, bVar7) {
        dest[sVar3] = "0123456789ABCDEF"[(ulong)num >> 0x3c];
        dest[sVar3 + 1] = "0123456789ABCDEF"[(byte)((ulong)num >> 0x38) & 0xf];
        sVar3 = sVar3 + 2;
        num = num << 8;
      }
    }
  }
  dest[sVar3] = '\0';
  return sVar3;
}

Assistant:

size_t fio_ltoa(char *dest, int64_t num, uint8_t base) {
  const char notation[] = {'0', '1', '2', '3', '4', '5', '6', '7',
                           '8', '9', 'A', 'B', 'C', 'D', 'E', 'F'};

  size_t len = 0;
  char buf[48]; /* we only need up to 20 for base 10, but base 3 needs 41... */

  if (!num)
    goto zero;

  switch (base) {
  case 1: /* fallthrough */
  case 2:
    /* Base 2 */
    {
      uint64_t n = num; /* avoid bit shifting inconsistencies with signed bit */
      uint8_t i = 0;    /* counting bits */
      dest[len++] = '0';
      dest[len++] = 'b';

      while ((i < 64) && (n & 0x8000000000000000) == 0) {
        n = n << 1;
        i++;
      }
      /* make sure the Binary representation doesn't appear signed. */
      if (i) {
        dest[len++] = '0';
      }
      /* write to dest. */
      while (i < 64) {
        dest[len++] = ((n & 0x8000000000000000) ? '1' : '0');
        n = n << 1;
        i++;
      }
      dest[len] = 0;
      return len;
    }
  case 8:
    /* Base 8 */
    {
      uint64_t l = 0;
      if (num < 0) {
        dest[len++] = '-';
        num = 0 - num;
      }
      dest[len++] = '0';

      while (num) {
        buf[l++] = '0' + (num & 7);
        num = num >> 3;
      }
      while (l) {
        --l;
        dest[len++] = buf[l];
      }
      dest[len] = 0;
      return len;
    }

  case 16:
    /* Base 16 */
    {
      uint64_t n = num; /* avoid bit shifting inconsistencies with signed bit */
      uint8_t i = 0;    /* counting bits */
      dest[len++] = '0';
      dest[len++] = 'x';
      while (i < 8 && (n & 0xFF00000000000000) == 0) {
        n = n << 8;
        i++;
      }
      /* make sure the Hex representation doesn't appear misleadingly signed. */
      if (i && (n & 0x8000000000000000)) {
        dest[len++] = '0';
        dest[len++] = '0';
      }
      /* write the damn thing, high to low */
      while (i < 8) {
        uint8_t tmp = (n & 0xF000000000000000) >> 60;
        dest[len++] = notation[tmp];
        tmp = (n & 0x0F00000000000000) >> 56;
        dest[len++] = notation[tmp];
        i++;
        n = n << 8;
      }
      dest[len] = 0;
      return len;
    }
  case 3: /* fallthrough */
  case 4: /* fallthrough */
  case 5: /* fallthrough */
  case 6: /* fallthrough */
  case 7: /* fallthrough */
  case 9: /* fallthrough */
    /* rare bases */
    if (num < 0) {
      dest[len++] = '-';
      num = 0 - num;
    }
    uint64_t l = 0;
    while (num) {
      uint64_t t = num / base;
      buf[l++] = '0' + (num - (t * base));
      num = t;
    }
    while (l) {
      --l;
      dest[len++] = buf[l];
    }
    dest[len] = 0;
    return len;

  default:
    break;
  }
  /* Base 10, the default base */

  if (num < 0) {
    dest[len++] = '-';
    num = 0 - num;
  }
  uint64_t l = 0;
  while (num) {
    uint64_t t = num / 10;
    buf[l++] = '0' + (num - (t * 10));
    num = t;
  }
  while (l) {
    --l;
    dest[len++] = buf[l];
  }
  dest[len] = 0;
  return len;

zero:
  switch (base) {
  case 1:
  case 2:
    dest[len++] = '0';
    dest[len++] = 'b';
    break;
  case 8:
    dest[len++] = '0';
    break;
  case 16:
    dest[len++] = '0';
    dest[len++] = 'x';
    dest[len++] = '0';
    break;
  }
  dest[len++] = '0';
  dest[len] = 0;
  return len;
}